

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_951a02::HandleTransformCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  initializer_list<ActionDescriptor> __l;
  invalid_argument *piVar1;
  size_t sVar2;
  iterator iVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  __type _Var6;
  uint uVar7;
  size_type sVar8;
  const_reference pvVar9;
  pointer pAVar10;
  _Base_ptr p_Var11;
  pointer pTVar12;
  size_t sVar13;
  undefined1 *puVar14;
  invalid_argument *piVar15;
  cmMakefile *pcVar16;
  _Base_ptr __n;
  ActionDescriptor *local_d00;
  string_view local_c38;
  string_view local_c28;
  string local_c18;
  string_view local_bf8;
  transform_error *e;
  string_view local_bb0;
  undefined1 local_ba0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string_view local_b78;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b68;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b58;
  string local_b48;
  cmAlphaNum local_b28;
  cmAlphaNum local_af8;
  string local_ac8;
  allocator<char> local_aa1;
  string local_aa0;
  unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
  local_a80;
  allocator<char> local_a71;
  string local_a70;
  invalid_argument *anon_var_0_2;
  size_t pos_2;
  string local_a38;
  invalid_argument *anon_var_0_1;
  size_t pos_1;
  int local_a00;
  int iStack_9fc;
  bool valid;
  int step;
  int stop;
  int start;
  undefined1 local_9d0 [16];
  string local_9c0;
  invalid_argument *anon_var_0;
  size_t sStack_990;
  int value;
  size_t pos;
  vector<int,_std::allocator<int>_> indexes;
  cmAlphaNum local_940;
  string local_910;
  undefined1 local_8f0 [16];
  string local_8e0;
  cmAlphaNum local_8c0;
  cmAlphaNum local_890;
  string local_860;
  allocator<char> local_839;
  undefined1 local_838 [8];
  string OUTPUT_VARIABLE;
  undefined1 local_810 [8];
  string FOR;
  undefined1 local_7e8 [8];
  string AT;
  undefined1 local_7c0 [8];
  string REGEX;
  transform_error *e_1;
  undefined1 local_768 [16];
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_758;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_750;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_748;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_740;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  cmAlphaNum local_720;
  cmAlphaNum local_6f0;
  string local_6c0;
  int local_69c;
  cmAlphaNum local_698;
  cmAlphaNum local_668;
  string local_638;
  _Self local_618;
  string local_610;
  key_type local_5f0;
  _Self local_5a8;
  iterator descriptor;
  size_type index;
  anon_class_8_1_bc00122b local_590;
  transform_type local_588;
  allocator<char> local_561;
  string local_560;
  anon_class_8_1_bc00122b local_540;
  transform_type local_538;
  allocator<char> local_511;
  string local_510;
  anon_class_8_1_bc00122b local_4f0;
  transform_type local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  anon_class_8_1_bc00122b local_4a0;
  transform_type local_498;
  allocator<char> local_471;
  string local_470;
  anon_class_8_1_bc00122b local_450;
  transform_type local_448;
  allocator<char> local_421;
  string local_420;
  anon_class_8_1_bc00122b local_400;
  transform_type local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  anon_class_8_1_bc00122b local_3b0;
  transform_type local_3a8;
  allocator<char> local_381;
  string local_380;
  ActionDescriptor *local_360;
  ActionDescriptor local_358;
  undefined1 local_310 [72];
  undefined1 local_2c8 [72];
  undefined1 local_280 [72];
  undefined1 local_238 [72];
  undefined1 local_1f0 [72];
  undefined1 local_1a8 [72];
  iterator local_160;
  size_type local_158;
  allocator<ActionDescriptor> local_14a;
  anon_class_1_0_00000001 local_149;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_148;
  undefined1 local_128 [8];
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  Command command;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar4 = local_20;
  if (sVar8 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command TRANSFORM requires an action to be specified.",
               &local_41);
    cmExecutionStatus::SetError(pcVar4,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Command::Command(std::__cxx11::
    string_const__(&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar9);
    std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0,void>
              ((function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_148
               ,&local_149);
    std::allocator<ActionDescriptor>::allocator(&local_14a);
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
           *)local_128,&local_148,&local_14a);
    std::allocator<ActionDescriptor>::~allocator(&local_14a);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_148);
    local_360 = &local_358;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"APPEND",&local_381);
    local_3b0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__1,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_3a8,&local_3b0)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(&local_358,&local_380,1,&local_3a8);
    local_360 = (ActionDescriptor *)local_310;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"PREPEND",&local_3d1);
    local_400.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__2,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_3f8,&local_400)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_310,&local_3d0,1,&local_3f8);
    local_360 = (ActionDescriptor *)local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"TOUPPER",&local_421);
    local_450.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__3,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_448,&local_450)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_2c8,&local_420,0,&local_448);
    local_360 = (ActionDescriptor *)local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"TOLOWER",&local_471);
    local_4a0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__4,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_498,&local_4a0)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_280,&local_470,0,&local_498);
    local_360 = (ActionDescriptor *)local_238;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"STRIP",&local_4c1);
    local_4f0.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__5,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_4e8,&local_4f0)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_238,&local_4c0,0,&local_4e8);
    local_360 = (ActionDescriptor *)local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"GENEX_STRIP",&local_511);
    local_540.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__6,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_538,&local_540)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_1f0,&local_510,0,&local_538);
    local_360 = (ActionDescriptor *)local_1a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"REPLACE",&local_561);
    local_590.command = (Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<(anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__7,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_588,&local_590)
    ;
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string,int,std::function<std::__cxx11::string(std::__cxx11::
    string_const__>_(local_1a8,&local_560,2,&local_588);
    local_160 = &local_358;
    local_158 = 7;
    __l._M_len = 7;
    __l._M_array = local_160;
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::operator=((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                 *)local_128,__l);
    local_d00 = (ActionDescriptor *)&local_160;
    do {
      local_d00 = local_d00 + -1;
      HandleTransformCommand::ActionDescriptor::~ActionDescriptor(local_d00);
    } while (local_d00 != &local_358);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_588);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator(&local_561);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_538);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_4e8);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_498);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_448);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_3a8);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    descriptor._M_node = (_Base_ptr)0x2;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    std::__cxx11::string::string((string *)&local_610,(string *)pvVar9);
    (anonymous_namespace)::HandleTransformCommand(std::vector<std::__cxx11::string,std::
    allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ActionDescriptor::
    ActionDescriptor(std::__cxx11::string_(&local_5f0,&local_610);
    local_5a8._M_node =
         (_Base_ptr)
         std::
         set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
         ::find((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                 *)local_128,&local_5f0);
    HandleTransformCommand::ActionDescriptor::~ActionDescriptor(&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    local_618._M_node =
         (_Base_ptr)
         std::
         set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
         ::end((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                *)local_128);
    bVar5 = std::operator==(&local_5a8,&local_618);
    pcVar4 = local_20;
    if (bVar5) {
      cmAlphaNum::cmAlphaNum(&local_668," sub-command TRANSFORM, ");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(size_type)descriptor._M_node);
      cmAlphaNum::cmAlphaNum(&local_698,pvVar9);
      cmStrCat<char[17]>(&local_638,&local_668,&local_698,(char (*) [17])" invalid action.");
      cmExecutionStatus::SetError(pcVar4,&local_638);
      std::__cxx11::string::~string((string *)&local_638);
      args_local._7_1_ = 0;
      local_69c = 1;
    }
    else {
      descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      iVar3._M_node = descriptor._M_node;
      pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
      pcVar4 = local_20;
      if (sVar8 < (ulong)((long)&(iVar3._M_node)->_M_color + (long)pAVar10->Arity)) {
        cmAlphaNum::cmAlphaNum(&local_6f0,"sub-command TRANSFORM, action ");
        pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        cmAlphaNum::cmAlphaNum(&local_720,&pAVar10->Name);
        pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        cmStrCat<char[10],int,char[14]>
                  (&local_6c0,&local_6f0,&local_720,(char (*) [10])" expects ",&pAVar10->Arity,
                   (char (*) [14])0xc76a71);
        cmExecutionStatus::SetError(pcVar4,&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        args_local._7_1_ = 0;
        local_69c = 1;
      }
      else {
        pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        std::__cxx11::string::operator=
                  ((string *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)pAVar10);
        pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        descriptor._M_node =
             (_Base_ptr)((long)&(descriptor._M_node)->_M_color + (long)pAVar10->Arity);
        pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
        if (0 < pAVar10->Arity) {
          local_748._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
          local_740 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+(&local_748,3);
          local_758._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
          local_750 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+(&local_758,(difference_type)descriptor._M_node);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_768 + 0xf));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_738
                     ,local_740,local_750,
                     (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_768 + 0xf));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&command.ListName.field_2 + 8),&local_738);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_738);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_768 + 0xf));
        }
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                "REPLACE");
        if (bVar5) {
          cmExecutionStatus::GetMakefile(local_20);
          std::
          make_unique<(anonymous_namespace)::TransformReplace,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmMakefile*>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_768,(cmMakefile **)((long)&command.ListName.field_2 + 8));
          std::
          unique_ptr<(anonymous_namespace)::TransformAction,std::default_delete<(anonymous_namespace)::TransformAction>>
          ::operator=((unique_ptr<(anonymous_namespace)::TransformAction,std::default_delete<(anonymous_namespace)::TransformAction>>
                       *)&command.Arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
                       *)local_768);
          std::
          unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformReplace,_std::default_delete<(anonymous_namespace)::TransformReplace>_>
                         *)local_768);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7c0,"REGEX",(allocator<char> *)(AT.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(AT.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7e8,"AT",(allocator<char> *)(FOR.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(FOR.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_810,"FOR",
                   (allocator<char> *)(OUTPUT_VARIABLE.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(OUTPUT_VARIABLE.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_838,"OUTPUT_VARIABLE",&local_839);
        std::allocator<char>::~allocator(&local_839);
LAB_0054f53a:
        do {
          p_Var11 = (_Base_ptr)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
          if (p_Var11 <= descriptor._M_node) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_ba0);
            pcVar16 = cmExecutionStatus::GetMakefile(local_20);
            bVar5 = GetList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_ba0,(string *)((long)&command.Name.field_2 + 8),pcVar16);
            if (bVar5) {
              bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&command.Action);
              if (!bVar5) {
                std::make_unique<(anonymous_namespace)::TransformNoSelector>();
                std::
                unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                             *)&command.Action,
                            (unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                             *)&e);
                std::
                unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
                               *)&e);
              }
              pTVar12 = std::
                        unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                      *)&command.Action);
              pAVar10 = std::_Rb_tree_const_iterator<ActionDescriptor>::operator->(&local_5a8);
              (*pTVar12->_vptr_TransformSelector[4])(pTVar12,local_ba0,&pAVar10->Transform);
              pcVar16 = cmExecutionStatus::GetMakefile(local_20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_c28,";");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c38);
              cmJoin(&local_c18,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_ba0,local_c28,local_c38);
              local_bf8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_c18);
              cmMakefile::AddDefinition(pcVar16,(string *)&command.Selector,local_bf8);
              std::__cxx11::string::~string((string *)&local_c18);
            }
            else {
              pcVar16 = cmExecutionStatus::GetMakefile(local_20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_bb0,"");
              cmMakefile::AddDefinition(pcVar16,(string *)&command.Selector,local_bb0);
            }
            args_local._7_1_ = 1;
            local_69c = 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_ba0);
            break;
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(size_type)descriptor._M_node);
          _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_7c0);
          if (_Var6) {
LAB_0054f5be:
            bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&command.Action);
            pcVar4 = local_20;
            if (bVar5) {
              cmAlphaNum::cmAlphaNum
                        (&local_890,"sub-command TRANSFORM, selector already specified (");
              pTVar12 = std::
                        unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                        ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                      *)&command.Action);
              cmAlphaNum::cmAlphaNum(&local_8c0,&pTVar12->Tag);
              cmStrCat<char[3]>(&local_860,&local_890,&local_8c0,(char (*) [3])0xc5a84c);
              cmExecutionStatus::SetError(pcVar4,&local_860);
              std::__cxx11::string::~string((string *)&local_860);
              args_local._7_1_ = 0;
              local_69c = 1;
              break;
            }
          }
          else {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(size_type)descriptor._M_node);
            _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_7e8);
            if (_Var6) goto LAB_0054f5be;
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(size_type)descriptor._M_node);
            _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_810);
            if (_Var6) goto LAB_0054f5be;
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(size_type)descriptor._M_node);
          _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_7c0);
          if (_Var6) {
            p_Var11 = (_Base_ptr)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
            pcVar4 = local_20;
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            if (p_Var11 == descriptor._M_node) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_8e0,
                         "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                         ,(allocator<char> *)(local_8f0 + 0xf));
              cmExecutionStatus::SetError(pcVar4,&local_8e0);
              std::__cxx11::string::~string((string *)&local_8e0);
              std::allocator<char>::~allocator((allocator<char> *)(local_8f0 + 0xf));
              args_local._7_1_ = 0;
              local_69c = 1;
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,(size_type)descriptor._M_node);
            std::
            make_unique<(anonymous_namespace)::TransformSelectorRegex,std::__cxx11::string_const&>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8f0);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
            ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                         *)&command.Action,
                        (unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
                         *)local_8f0);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
                           *)local_8f0);
            pTVar12 = std::
                      unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                      ::operator->((unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                                    *)&command.Action);
            uVar7 = (*pTVar12->_vptr_TransformSelector[2])(pTVar12,0);
            pcVar4 = local_20;
            if ((uVar7 & 1) == 0) {
              cmAlphaNum::cmAlphaNum
                        (&local_940,
                         "sub-command TRANSFORM, selector REGEX failed to compile regex \"");
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(size_type)descriptor._M_node);
              cmAlphaNum::cmAlphaNum
                        ((cmAlphaNum *)
                         &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar9);
              cmStrCat<char[3]>(&local_910,&local_940,
                                (cmAlphaNum *)
                                &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(char (*) [3])0xc51f8d);
              cmExecutionStatus::SetError(pcVar4,&local_910);
              std::__cxx11::string::~string((string *)&local_910);
              args_local._7_1_ = 0;
              local_69c = 1;
              break;
            }
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            goto LAB_0054f53a;
          }
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(size_type)descriptor._M_node);
          _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_7e8);
          if (!_Var6) {
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(size_type)descriptor._M_node);
            _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_810);
            if (_Var6) {
              puVar14 = (undefined1 *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
              pcVar4 = local_20;
              p_Var11 = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (puVar14 <= (byte *)((long)&(descriptor._M_node)->_M_color + 2U)) {
                descriptor._M_node = p_Var11;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&start,
                           "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                           (allocator<char> *)((long)&stop + 3));
                cmExecutionStatus::SetError(pcVar4,(string *)&start);
                std::__cxx11::string::~string((string *)&start);
                std::allocator<char>::~allocator((allocator<char> *)((long)&stop + 3));
                args_local._7_1_ = 0;
                local_69c = 1;
                break;
              }
              step = 0;
              iStack_9fc = 0;
              local_a00 = 1;
              pos_1._7_1_ = 1;
              descriptor._M_node = p_Var11;
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(size_type)p_Var11);
              step = std::__cxx11::stoi(pvVar9,(size_t *)&anon_var_0_1,10);
              piVar1 = anon_var_0_1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,(size_type)descriptor._M_node);
              piVar15 = (invalid_argument *)std::__cxx11::string::length();
              if (piVar1 == piVar15) {
                descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(size_type)descriptor._M_node);
                iStack_9fc = std::__cxx11::stoi(pvVar9,(size_t *)&anon_var_0_1,10);
                piVar1 = anon_var_0_1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,(size_type)descriptor._M_node);
                piVar15 = (invalid_argument *)std::__cxx11::string::length();
                if (piVar1 != piVar15) {
                  pos_1._7_1_ = 0;
                }
              }
              else {
                pos_1._7_1_ = 0;
              }
              pcVar4 = local_20;
              if ((pos_1._7_1_ & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a38,
                           "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                           ,(allocator<char> *)((long)&pos_2 + 7));
                cmExecutionStatus::SetError(pcVar4,&local_a38);
                std::__cxx11::string::~string((string *)&local_a38);
                std::allocator<char>::~allocator((allocator<char> *)((long)&pos_2 + 7));
                args_local._7_1_ = 0;
                local_69c = 1;
                break;
              }
              p_Var11 = (_Base_ptr)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
              descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (descriptor._M_node < p_Var11) {
                pvVar9 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)status_local,(size_type)descriptor._M_node);
                local_a00 = std::__cxx11::stoi(pvVar9,(size_t *)&anon_var_0_2,10);
                piVar1 = anon_var_0_2;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,(size_type)descriptor._M_node);
                piVar15 = (invalid_argument *)std::__cxx11::string::length();
                if (piVar1 == piVar15) {
                  descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
                }
                else {
                  local_a00 = 1;
                }
              }
              pcVar4 = local_20;
              if (local_a00 < 1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a70,
                           "sub-command TRANSFORM, selector FOR expects positive numeric value for <step>."
                           ,&local_a71);
                cmExecutionStatus::SetError(pcVar4,&local_a70);
                std::__cxx11::string::~string((string *)&local_a70);
                std::allocator<char>::~allocator(&local_a71);
                args_local._7_1_ = 0;
                local_69c = 1;
                break;
              }
              std::make_unique<(anonymous_namespace)::TransformSelectorFor,int&,int&,int&>
                        ((int *)&local_a80,&step,&stack0xfffffffffffff604);
              std::
              unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
              ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                           *)&command.Action,&local_a80);
              std::
              unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
              ::~unique_ptr(&local_a80);
            }
            else {
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(size_type)descriptor._M_node);
              _Var6 = std::operator==(pvVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_838);
              pcVar4 = local_20;
              if (!_Var6) {
                cmAlphaNum::cmAlphaNum(&local_af8,"sub-command TRANSFORM, \'");
                local_b68 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local);
                local_b58 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::advance(&local_b68,(difference_type)descriptor._M_node);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_b78," ");
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &varArgsExpanded.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                cmJoin(&local_b48,&local_b58,local_b78,stack0xfffffffffffff478);
                cmAlphaNum::cmAlphaNum(&local_b28,&local_b48);
                cmStrCat<char[27]>(&local_ac8,&local_af8,&local_b28,
                                   (char (*) [27])"\': unexpected argument(s).");
                cmExecutionStatus::SetError(pcVar4,&local_ac8);
                std::__cxx11::string::~string((string *)&local_ac8);
                std::__cxx11::string::~string((string *)&local_b48);
                args_local._7_1_ = 0;
                local_69c = 1;
                break;
              }
              p_Var11 = (_Base_ptr)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local);
              pcVar4 = local_20;
              __n = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
              if (p_Var11 == __n) {
                descriptor._M_node = __n;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_aa0,
                           "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",
                           &local_aa1);
                cmExecutionStatus::SetError(pcVar4,&local_aa0);
                std::__cxx11::string::~string((string *)&local_aa0);
                std::allocator<char>::~allocator(&local_aa1);
                args_local._7_1_ = 0;
                local_69c = 1;
                break;
              }
              descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 2);
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)status_local,(size_type)__n);
              std::__cxx11::string::operator=((string *)&command.Selector,(string *)pvVar9);
            }
            goto LAB_0054f53a;
          }
          std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&pos);
          while( true ) {
            p_Var11 = (_Base_ptr)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
            descriptor._M_node = (_Base_ptr)((long)&(descriptor._M_node)->_M_color + 1);
            if (p_Var11 <= descriptor._M_node) break;
            pvVar9 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,(size_type)descriptor._M_node);
            anon_var_0._4_4_ = std::__cxx11::stoi(pvVar9,&stack0xfffffffffffff670,10);
            sVar2 = sStack_990;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,(size_type)descriptor._M_node);
            sVar13 = std::__cxx11::string::length();
            if (sVar2 != sVar13) break;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&pos,
                       (value_type_conflict1 *)((long)&anon_var_0 + 4));
          }
          bVar5 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)&pos);
          pcVar4 = local_20;
          if (bVar5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9c0,
                       "sub-command TRANSFORM, selector AT expects at least one numeric value.",
                       (allocator<char> *)(local_9d0 + 0xf));
            cmExecutionStatus::SetError(pcVar4,&local_9c0);
            std::__cxx11::string::~string((string *)&local_9c0);
            std::allocator<char>::~allocator((allocator<char> *)(local_9d0 + 0xf));
            args_local._7_1_ = 0;
            local_69c = 1;
          }
          else {
            std::
            make_unique<(anonymous_namespace)::TransformSelectorAt,std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)local_9d0);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
            ::operator=((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
                         *)&command.Action,
                        (unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                         *)local_9d0);
            std::
            unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                           *)local_9d0);
            local_69c = 2;
          }
          std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&pos)
          ;
        } while (local_69c == 2);
        std::__cxx11::string::~string((string *)local_838);
        std::__cxx11::string::~string((string *)local_810);
        std::__cxx11::string::~string((string *)local_7e8);
        std::__cxx11::string::~string((string *)local_7c0);
      }
    }
    std::
    set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
    ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
            *)local_128);
    HandleTransformCommand::Command::~Command
              ((Command *)&descriptors._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleTransformCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return this->Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmTrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    status.SetError(
      cmStrCat(" sub-command TRANSFORM, ", args[index], " invalid action."));
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    status.SetError(cmStrCat("sub-command TRANSFORM, action ",
                             descriptor->Name, " expects ", descriptor->Arity,
                             " argument(s)."));
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action = cm::make_unique<TransformReplace>(
        command.Arguments, &status.GetMakefile());
    } catch (const transform_error& e) {
      status.SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" };
  const std::string AT{ "AT" };
  const std::string FOR{ "FOR" };
  const std::string OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      status.SetError(
        cmStrCat("sub-command TRANSFORM, selector already specified (",
                 command.Selector->Tag, ")."));

      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, selector REGEX expects "
                        "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        status.SetError(
          cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
                   "regex \"",
                   args[index], "\"."));
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        status.SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        status.SetError(
          "sub-command TRANSFORM, selector FOR expects, at least,"
          " two arguments.");
        return false;
      }

      int start = 0;
      int stop = 0;
      int step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        status.SetError("sub-command TRANSFORM, selector FOR expects, "
                        "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step <= 0) {
        status.SetError("sub-command TRANSFORM, selector FOR expects "
                        "positive numeric value for <step>.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                        "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    status.SetError(cmStrCat("sub-command TRANSFORM, '",
                             cmJoin(cmMakeRange(args).advance(index), " "),
                             "': unexpected argument(s)."));
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, command.ListName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    status.SetError(e.what());
    return false;
  }

  status.GetMakefile().AddDefinition(command.OutputName,
                                     cmJoin(varArgsExpanded, ";"));

  return true;
}